

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

stumpless_param * stumpless_get_param_by_name(stumpless_element *element,char *name)

{
  _Bool _Var1;
  int iVar2;
  stumpless_element *psStack_38;
  int cmp_result;
  stumpless_param *param;
  size_t i;
  size_t name_length;
  char *name_local;
  stumpless_element *element_local;
  
  name_length = (size_t)name;
  name_local = element->name;
  if (element == (stumpless_element *)0x0) {
    raise_argument_empty("element was NULL");
    element_local = (stumpless_element *)0x0;
  }
  else if (name == (char *)0x0) {
    raise_argument_empty("name was NULL");
    element_local = (stumpless_element *)0x0;
  }
  else {
    _Var1 = validate_param_name(name,&i);
    if (_Var1) {
      clear_error();
      lock_element((stumpless_element *)name_local);
      for (param = (stumpless_param *)0x0; param < *(stumpless_param **)(name_local + 0x38);
          param = (stumpless_param *)(param->name + 1)) {
        psStack_38 = *(stumpless_element **)(*(long *)(name_local + 0x30) + (long)param * 8);
        lock_param((stumpless_param *)psStack_38);
        iVar2 = strcmp(psStack_38->name,(char *)name_length);
        unlock_param((stumpless_param *)psStack_38);
        if (iVar2 == 0) goto LAB_0010b53d;
      }
      psStack_38 = (stumpless_element *)0x0;
      raise_param_not_found();
LAB_0010b53d:
      unlock_element((stumpless_element *)name_local);
      element_local = psStack_38;
    }
    else {
      element_local = (stumpless_element *)0x0;
    }
  }
  return (stumpless_param *)element_local;
}

Assistant:

struct stumpless_param *
stumpless_get_param_by_name( const struct stumpless_element *element,
                             const char *name ) {
  size_t name_length;
  size_t i;
  struct stumpless_param *param;
  int cmp_result;

  VALIDATE_ARG_NOT_NULL( element );
  VALIDATE_ARG_NOT_NULL( name );

  if( unlikely( !validate_param_name( name, &name_length ) ) ) {
    return NULL;
  }

  clear_error(  );
  lock_element( element );
  FOR_EACH_PARAM_WITH_NAME( element, name )
    goto cleanup_and_return;
  }